

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ai.cxx
# Opt level: O0

int __thiscall xray_re::ai_node::link(ai_node *this,char *__from,char *__to)

{
  uint32_t uVar1;
  uint_fast32_t side_local;
  ai_node *this_local;
  
  switch(__from) {
  case (char *)0x0:
    uVar1 = as_u32(this->data);
    this_local._4_4_ = uVar1 & 0x7fffff;
    break;
  case (char *)0x1:
    uVar1 = as_u32(this->data + 2);
    this_local._4_4_ = uVar1 >> 7 & 0x7fffff;
    break;
  case (char *)0x2:
    uVar1 = as_u32(this->data + 5);
    this_local._4_4_ = uVar1 >> 6 & 0x7fffff;
    break;
  case (char *)0x3:
    uVar1 = as_u32(this->data + 8);
    this_local._4_4_ = uVar1 >> 5 & 0x7fffff;
    break;
  default:
    this_local._4_4_ = 0x7fffff;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t ai_node::link(uint_fast32_t side) const
{
	switch (side) {
	case 0: return as_u32(data) & AI_MAP_LINK_MASK;
	case 1: return (as_u32(data + 2) >> 7) & AI_MAP_LINK_MASK;
	case 2: return (as_u32(data + 5) >> 6) & AI_MAP_LINK_MASK;
	case 3: return (as_u32(data + 8) >> 5) & AI_MAP_LINK_MASK;
	}
	return AI_MAP_BAD_LINK;
}